

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O2

void compRHS(double **F,double **G,double **RHS,lattice *grid,double delt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = grid->delx;
  uVar2 = grid->dely;
  iVar3 = grid->deli;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (uVar4 = 1; uVar4 != iVar3 + 1; uVar4 = uVar4 + 1) {
    uVar5 = (ulong)(uint)grid->delj;
    if (grid->delj < 1) {
      uVar5 = 0;
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      auVar7._0_8_ = F[uVar4][uVar6 + 1] - F[uVar4 - 1][uVar6 + 1];
      auVar7._8_8_ = G[uVar4][uVar6 + 1] - G[uVar4][uVar6];
      auVar8._8_8_ = delt * (double)uVar2;
      auVar8._0_8_ = delt * (double)uVar1;
      auVar8 = divpd(auVar7,auVar8);
      RHS[uVar4 - 1][uVar6] = auVar8._8_8_ + auVar8._0_8_;
    }
  }
  return;
}

Assistant:

void compRHS (REAL **F, REAL **G, REAL **RHS, lattice *grid, REAL delt)
{
	REAL facX = delt*(grid->delx);
	REAL facY = delt*(grid->dely);
	REAL tmp;
	for (int i = 1; i <= grid->deli; i++)
		for (int j = 1; j <= grid->delj; j++)
		{
			tmp = (F[i][j] - F[i-1][j])/facX;
			RHS[i-1][j-1] = tmp + (G[i][j] - G[i][j-1])/facY;
		}
	return;
}